

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O0

size_t nni_url_decode(uint8_t *out,char *in,size_t max_len)

{
  uint8_t uVar1;
  ushort **ppuVar2;
  char *pcVar3;
  ulong uStack_30;
  uint8_t c;
  size_t len;
  size_t max_len_local;
  char *in_local;
  uint8_t *out_local;
  
  uStack_30 = 0;
  max_len_local = (size_t)in;
  while( true ) {
    uVar1 = *(uint8_t *)max_len_local;
    if (uVar1 == '\0') {
      return uStack_30;
    }
    if (max_len <= uStack_30) break;
    if (uVar1 == '%') {
      ppuVar2 = __ctype_b_loc();
      if ((((*ppuVar2)[(int)*(char *)(max_len_local + 1)] & 0x1000) == 0) ||
         (ppuVar2 = __ctype_b_loc(), ((*ppuVar2)[(int)*(char *)(max_len_local + 2)] & 0x1000) == 0))
      {
        return 0xffffffffffffffff;
      }
      pcVar3 = (char *)(max_len_local + 2);
      uVar1 = url_hex_val(*(char *)(max_len_local + 1));
      out[uStack_30] = uVar1;
      out[uStack_30] = out[uStack_30] << 4;
      max_len_local = max_len_local + 3;
      uVar1 = url_hex_val(*pcVar3);
      out[uStack_30] = out[uStack_30] + uVar1;
    }
    else {
      out[uStack_30] = uVar1;
      max_len_local = max_len_local + 1;
    }
    uStack_30 = uStack_30 + 1;
  }
  return 0xffffffffffffffff;
}

Assistant:

size_t
nni_url_decode(uint8_t *out, const char *in, size_t max_len)
{
	size_t  len;
	uint8_t c;

	len = 0;
	while ((c = (uint8_t) *in) != '\0') {
		if (len >= max_len) {
			return ((size_t) -1);
		}
		if (c == '%') {
			in++;
			if ((!isxdigit(in[0])) || (!isxdigit(in[1]))) {
				return ((size_t) -1);
			}
			out[len] = url_hex_val(*in++);
			out[len] <<= 4u;
			out[len] += url_hex_val(*in++);
			len++;
		} else {
			out[len++] = c;
			in++;
		}
	}
	return (len);
}